

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

bool __thiscall RowSampler::sample(RowSampler *this)

{
  uint uVar1;
  int local_1c;
  uint row;
  RowSampler *this_local;
  
  if (this->_step == 1) {
    this_local._7_1_ = true;
  }
  else {
    this->_count = this->_count + 1;
    if (this->_count == this->_next) {
      this->_sampled = this->_sampled + 1;
      local_1c = 1;
      if (this->_mode == RANDOM) {
        uVar1 = rand();
        local_1c = uVar1 % this->_step + 1;
      }
      this->_next = this->_sampled * this->_step + local_1c;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
    sample()
    {
        // Don't bother if samling every row
        if (this->_step == 1) return true;

        // Bump row counter
        this->_count++;

        // Check if this row is sampled
        if (this->_count == this->_next)
        {
            // Bump sampled counter
            this->_sampled++;

            // If yes, determine next row in this sampling bin to sample
            unsigned int row = 1;
            if (this->_mode == SamplerOptions::RANDOM)
            {
                row = 1 + (unsigned int)(rand() % this->_step);
            }
            this->_next = this->_sampled * this->_step + row;

            return true;
        }

        return false;

    }